

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O2

bool __thiscall xLearn::Checker::check_prediction_param(Checker *this,HyperParam *hyper_param)

{
  bool bVar1;
  bool bVar2;
  Checker *this_00;
  string local_40;
  
  if (hyper_param->from_file == true) {
    bVar2 = FileExist((hyper_param->test_set_file)._M_dataplus._M_p);
    bVar1 = true;
    if (bVar2) goto LAB_00160287;
    StringPrintf_abi_cxx11_
              (&local_40,"Test set file: %s does not exist.",
               (hyper_param->test_set_file)._M_dataplus._M_p);
    Color::print_error(&local_40);
  }
  else {
    bVar1 = true;
    if (hyper_param->test_dataset != (DMatrix *)0x0) goto LAB_00160287;
    StringPrintf_abi_cxx11_(&local_40,"Test dataset is None, please check!");
    Color::print_error(&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = false;
LAB_00160287:
  this_00 = (Checker *)(hyper_param->model_file)._M_dataplus._M_p;
  bVar2 = FileExist((char *)this_00);
  if (bVar2) {
    if (-1 < hyper_param->thread_number) {
      if (!bVar1) {
        return false;
      }
      check_conflict_predict(this_00,hyper_param);
      if (hyper_param->res_out == true) {
        if ((hyper_param->output_file)._M_string_length == 0) {
          std::operator+(&local_40,&hyper_param->test_set_file,".out");
          std::__cxx11::string::operator=((string *)&hyper_param->output_file,(string *)&local_40);
          std::__cxx11::string::~string((string *)&local_40);
          return true;
        }
        return true;
      }
      return true;
    }
  }
  else {
    StringPrintf_abi_cxx11_
              (&local_40,"Model file: %s does not exist.",(hyper_param->model_file)._M_dataplus._M_p
              );
    Color::print_error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (-1 < hyper_param->thread_number) {
      return false;
    }
  }
  StringPrintf_abi_cxx11_(&local_40,"The thread number must be greater than zero: %d.");
  Color::print_error(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

bool Checker::check_prediction_param(HyperParam& hyper_param) {
 bool bo = true;
 /*********************************************************
  *  Check the path of test set file                      *
  *********************************************************/
 if (hyper_param.from_file) {
  if (!FileExist(hyper_param.test_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Test set file: %s does not exist.",
            hyper_param.test_set_file.c_str())
      );
      bo =  false;
  }
 } else {
   if (hyper_param.test_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Test dataset is None, please check!")
      );
      bo =  false;
   }
 }
 /*********************************************************
  *  Check the path of model file                         *
  *********************************************************/
 if (!FileExist(hyper_param.model_file.c_str())) {
    Color::print_error(
      StringPrintf("Model file: %s does not exist.",
           hyper_param.model_file.c_str())
    );
    bo = false;
 }
 /*********************************************************
  *  Check invalid value                                  *
  *********************************************************/
 if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
 if (!bo) return false;
 /*********************************************************
  *  Check warning and fix conflict                       *
  *********************************************************/
 check_conflict_predict(hyper_param);
 /*********************************************************
  *  Set default value                                    *
  *********************************************************/
 if (hyper_param.res_out) {
  if (hyper_param.output_file.empty()) {
    hyper_param.output_file = hyper_param.test_set_file + ".out";
  }
 }

 return true;
}